

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O3

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__args;
  pointer *ppdVar2;
  iterator __position;
  _Base_ptr p_Var3;
  size_t sVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  entry *peVar8;
  time_point tVar9;
  long lVar10;
  _Base_ptr p_Var11;
  uint uVar12;
  ulong uVar13;
  pointer pdVar14;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> str;
  
  uVar6 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  uVar12 = 0x5460;
  if (uVar6 < 0x5460) {
    uVar12 = uVar6;
  }
  if ((int)uVar6 < 0) {
    uVar12 = 0;
  }
  key._M_str = "interval";
  key._M_len = 8;
  peVar8 = entry::operator[](item,key);
  entry::operator=(peVar8,(ulong)uVar12);
  sVar4 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00._M_str = "num";
  key_00._M_len = 3;
  peVar8 = entry::operator[](item,key_00);
  entry::operator=(peVar8,(long)(int)sVar4);
  tVar9 = aux::time_now();
  uVar6 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4093);
  uVar7 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x4094);
  uVar12 = 0x14;
  if (uVar7 < 0x14) {
    uVar12 = uVar7;
  }
  if ((int)uVar7 < 0) {
    uVar12 = 0;
  }
  uVar7 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar12 < (int)uVar7) {
    uVar7 = uVar12;
  }
  if (0 < (int)uVar6) {
    uVar13 = 0x5460;
    if (uVar6 < 0x5460) {
      uVar13 = (ulong)uVar6;
    }
    if ((long)tVar9.__d.__r <
        (long)(uVar13 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) {
      pdVar14 = (this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = (long)(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar14;
      if ((int)uVar12 <= (int)(uVar13 >> 2) * -0x33333333) goto LAB_003aa79c;
    }
  }
  pdVar14 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar14) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar14;
  }
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::reserve
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             &this->m_infohashes_sample,(long)(int)uVar7);
  p_Var11 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var11 != p_Var1) {
    uVar12 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      if (uVar7 == 0) break;
      lVar10 = aux::random((aux *)(ulong)uVar12);
      if ((uint)lVar10 <= uVar7) {
        __args = p_Var11 + 1;
        __position._M_current =
             (this->m_infohashes_sample).samples.
             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
          _M_realloc_insert<libtorrent::digest32<160l>const&>
                    ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                      *)&this->m_infohashes_sample,__position,(digest32<160L> *)__args);
        }
        else {
          ((__position._M_current)->m_number)._M_elems[4] = *(uint *)&p_Var11[1]._M_left;
          uVar5 = *(undefined4 *)&__args->field_0x4;
          p_Var3 = p_Var11[1]._M_parent;
          ((__position._M_current)->m_number)._M_elems[0] = __args->_M_color;
          ((__position._M_current)->m_number)._M_elems[1] = uVar5;
          *(_Base_ptr *)(((__position._M_current)->m_number)._M_elems + 2) = p_Var3;
          ppdVar2 = &(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppdVar2 = *ppdVar2 + 1;
        }
        uVar7 = uVar7 - 1;
      }
      p_Var11 = (_Base_ptr)::std::_Rb_tree_increment(p_Var11);
      uVar12 = uVar12 - 1;
    } while ((_Rb_tree_header *)p_Var11 != p_Var1);
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar9.__d.__r;
  pdVar14 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(this->m_infohashes_sample).samples.
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar14;
LAB_003aa79c:
  key_01._M_str = "samples";
  key_01._M_len = 7;
  peVar8 = entry::operator[](item,key_01);
  str.m_len = uVar13;
  str.m_ptr = (char *)pdVar14;
  entry::operator=(peVar8,str);
  return (int)((ulong)((long)(this->m_infohashes_sample).samples.
                             super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             .
                             super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_infohashes_sample).samples.
                            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = std::clamp(m_settings.get_int(settings_pack::dht_sample_infohashes_interval)
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}